

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O1

aspa_status
aspa_table_update_swap_in_compute
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update **update)

{
  aspa_store_node **ppaVar1;
  aspa_update_operation *paVar2;
  aspa_array *paVar3;
  size_t __nmemb;
  uint32_t *__base;
  aspa_array *array;
  aspa_status aVar4;
  aspa_status aVar5;
  aspa_update *paVar6;
  aspa_store_node *paVar7;
  aspa_record *paVar8;
  aspa_store_node *paVar9;
  aspa_record *paVar10;
  aspa_update_operation *paVar11;
  uint uVar12;
  ulong uVar13;
  aspa_store_node **ppaVar14;
  size_t index;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  aspa_array *new_array;
  aspa_status local_94;
  aspa_array *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a5,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a6,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (update == (aspa_update **)0x0) {
    __assert_fail("update",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a7,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    aVar4 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010e116;
  }
  if (*update == (aspa_update *)0x0) {
    paVar6 = (aspa_update *)lrtr_malloc(0x30);
    *update = paVar6;
    if (paVar6 != (aspa_update *)0x0) goto LAB_0010dc6e;
  }
  else {
LAB_0010dc6e:
    pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
    (*update)->table = aspa_table;
    (*update)->operations = operations;
    paVar6 = *update;
    paVar6->operation_count = count;
    paVar6->failed_operation = (aspa_update_operation *)0x0;
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    ppaVar1 = &aspa_table->store;
    paVar9 = aspa_table->store;
    if (paVar9 == (aspa_store_node *)0x0) {
      ppaVar14 = (aspa_store_node **)0x0;
    }
    else {
      ppaVar14 = ppaVar1;
      if (paVar9->rtr_socket != rtr_socket) {
        ppaVar14 = (aspa_store_node **)0x0;
        do {
          paVar7 = paVar9;
          paVar9 = paVar7->next;
          if (paVar9 == (aspa_store_node *)0x0) goto LAB_0010dcec;
        } while (paVar9->rtr_socket != rtr_socket);
        ppaVar14 = &paVar7->next;
      }
    }
LAB_0010dcec:
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    if ((ppaVar14 != (aspa_store_node **)0x0) && (*ppaVar14 != (aspa_store_node *)0x0)) {
LAB_0010dd0f:
      if (*ppaVar14 == (aspa_store_node *)0x0) {
        __assert_fail("*node",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x1dc,
                      "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                     );
      }
      if ((*ppaVar14)->aspa_array == (aspa_array *)0x0) {
        __assert_fail("(*node)->aspa_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x1dd,
                      "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                     );
      }
      local_40 = (aspa_array *)0x0;
      aVar5 = aspa_array_create(&local_40);
      aVar4 = ASPA_ERROR;
      if (aVar5 == ASPA_SUCCESS) {
        pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
        array = local_40;
        paVar3 = (*ppaVar14)->aspa_array;
        if (paVar3 == (aspa_array *)0x0) {
          __assert_fail("array",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11c,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        if (operations == (aspa_update_operation *)0x0) {
          __assert_fail("operations",
                        "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                        ,0x11d,
                        "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                       );
        }
        paVar6 = *update;
        aspa_array_reserve(local_40,paVar3->size + count);
        index = 0;
        bVar15 = true;
        uVar13 = 0;
        do {
          paVar2 = operations + uVar13;
          paVar11 = (aspa_update_operation *)0x0;
          if (uVar13 < count - 1) {
            paVar11 = operations + uVar13 + 1;
          }
          if ((operations + uVar13 + 1)[-1].type == ASPA_REMOVE) {
            if ((paVar2->record).provider_count != 0) {
              __assert_fail("current->record.provider_count == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12d,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
            if ((paVar2->record).provider_asns != (uint32_t *)0x0) {
              __assert_fail("!current->record.provider_asns",
                            "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                            ,0x12e,
                            "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                           );
            }
          }
          __nmemb = (paVar2->record).provider_count;
          if ((__nmemb != 0) && (__base = (paVar2->record).provider_asns, __base != (uint32_t *)0x0)
             ) {
            qsort(__base,__nmemb,4,compare_asns);
          }
          paVar10 = &paVar2->record;
          do {
            if (paVar3->size <= index) goto LAB_0010de80;
            paVar8 = aspa_array_get_record(paVar3,index);
            uVar12 = 6;
            if (paVar8->customer_asn < paVar10->customer_asn) {
              index = index + 1;
              uVar12 = 0;
              aVar4 = aspa_array_append(array,paVar8,false);
              if (aVar4 != ASPA_SUCCESS) {
                paVar6->failed_operation = paVar2;
                local_94 = ASPA_ERROR;
                uVar12 = 1;
              }
            }
          } while (uVar12 == 0);
          if (uVar12 == 6) {
LAB_0010de80:
            paVar8 = aspa_array_get_record(paVar3,index);
            if (paVar8 == (aspa_record *)0x0) {
              bVar16 = false;
            }
            else {
              bVar16 = paVar8->customer_asn == paVar10->customer_asn;
            }
            uVar12 = 0;
            bVar17 = false;
            if (uVar13 < count - 1) {
              bVar17 = (paVar11->record).customer_asn == paVar10->customer_asn;
            }
            if (paVar2->type == ASPA_REMOVE) {
              if (!bVar16) {
                paVar6->failed_operation = paVar2;
                local_94 = ASPA_RECORD_NOT_FOUND;
                goto LAB_0010df8a;
              }
              if ((bVar17) && (paVar11->type == ASPA_REMOVE)) {
                paVar6->failed_operation = paVar11;
                local_94 = ASPA_RECORD_NOT_FOUND;
                uVar12 = 1;
              }
              else {
                index = index + 1;
                (paVar2->record).provider_count = paVar8->provider_count;
                (paVar2->record).provider_asns = paVar8->provider_asns;
              }
            }
            else if (paVar2->type == ASPA_ADD) {
              if (bVar16) {
                paVar6->failed_operation = paVar2;
LAB_0010ded6:
                local_94 = ASPA_DUPLICATE_RECORD;
              }
              else {
                if (bVar17) {
                  if (paVar11->type == ASPA_ADD) {
                    paVar6->failed_operation = paVar11;
                    (paVar2->record).provider_asns = (uint32_t *)0x0;
                    goto LAB_0010ded6;
                  }
                  if (!(bool)(bVar17 ^ 1U | paVar11->type != ASPA_REMOVE)) {
                    paVar2->is_no_op = true;
                    paVar11->is_no_op = true;
                    uVar12 = 0;
                    uVar13 = uVar13 + 1;
                    goto LAB_0010df94;
                  }
                }
                aVar4 = aspa_array_append(array,paVar10,true);
                if (aVar4 == ASPA_SUCCESS) {
                  paVar10 = aspa_array_get_record(array,(ulong)(array->size - 1));
                  (paVar2->record).provider_asns = paVar10->provider_asns;
                  goto LAB_0010df94;
                }
                paVar6->failed_operation = paVar2;
                local_94 = ASPA_ERROR;
              }
LAB_0010df8a:
              uVar12 = 1;
            }
          }
LAB_0010df94:
          if ((uVar12 & 3) != 0) break;
          uVar13 = uVar13 + 1;
          bVar15 = uVar13 < count;
        } while (bVar15);
        aVar4 = local_94;
        if ((!bVar15) && (aVar4 = ASPA_SUCCESS, index < paVar3->size)) {
          aVar4 = ASPA_SUCCESS;
          do {
            paVar10 = aspa_array_get_record(paVar3,index);
            aspa_array_append(array,paVar10,false);
            index = index + 1;
          } while (index < paVar3->size);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        if (aVar4 == ASPA_SUCCESS) {
          (*update)->node = *ppaVar14;
          (*update)->new_array = local_40;
        }
        else {
          (*update)->node = (aspa_store_node *)0x0;
          (*update)->new_array = (aspa_array *)0x0;
          aspa_array_free(local_40,false);
        }
      }
      goto LAB_0010e116;
    }
    local_40 = (aspa_array *)0x0;
    aVar4 = aspa_array_create(&local_40);
    if (aVar4 == ASPA_SUCCESS) {
      pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
      paVar3 = local_40;
      paVar9 = (aspa_store_node *)lrtr_malloc(0x18);
      if (paVar9 != (aspa_store_node *)0x0) {
        paVar9->rtr_socket = rtr_socket;
        paVar9->aspa_array = paVar3;
        paVar9->next = *ppaVar1;
        *ppaVar1 = paVar9;
        if ((ppaVar1 != (aspa_store_node **)0x0) && (*ppaVar1 != (aspa_store_node *)0x0)) {
          pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
          ppaVar14 = ppaVar1;
          goto LAB_0010dd0f;
        }
      }
      aspa_array_free(local_40,false);
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
  }
  aVar4 = ASPA_ERROR;
LAB_0010e116:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return aVar4;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						   struct aspa_update_operation *operations, size_t count,
						   struct aspa_update **update)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(update);

	if (!aspa_table || !rtr_socket || !update || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	if (!*update) {
		*update = lrtr_malloc(sizeof(struct aspa_update));

		if (!*update)
			return ASPA_ERROR;
	}

	// MARK: Update Lock
	// Prevent interim writes to the table: We need to make sure the table stays the same
	// until the cleanup since the computed update is based on the state the table is in right now
	pthread_rwlock_wrlock(&aspa_table->update_lock);

	(*update)->table = aspa_table;
	(*update)->operations = operations;
	(*update)->operation_count = count;
	(*update)->failed_operation = NULL;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_rdlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	pthread_rwlock_unlock(&aspa_table->lock);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		pthread_rwlock_wrlock(&aspa_table->lock);
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
		pthread_rwlock_unlock(&aspa_table->lock);
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	// Create new array that will hold updated record data
	struct aspa_array *new_array = NULL;

	if (aspa_array_create(&new_array) != ASPA_SUCCESS)
		return ASPA_ERROR;

	// Populate new_array
	pthread_rwlock_rdlock(&aspa_table->lock);
	enum aspa_status res = aspa_table_update_compute_internal(rtr_socket, (*node)->aspa_array, new_array,
								  operations, count, &(*update)->failed_operation);
	pthread_rwlock_unlock(&aspa_table->lock);

	if (res == ASPA_SUCCESS) {
		(*update)->node = *node;
		(*update)->new_array = new_array;
	} else {
		(*update)->node = NULL;
		(*update)->new_array = NULL;

		// Update computation failed so release newly created array.
		// We must not release associated provider arrays here.
		aspa_array_free(new_array, false);
	}
	return res;
}